

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O2

ostream * operator<<(ostream *strm,Person *obj)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(strm,"name: ");
  poVar1 = std::operator<<(poVar1,(string *)&obj->name);
  poVar1 = std::operator<<(poVar1,"\nid: ");
  poVar1 = std::operator<<(poVar1,(string *)&obj->id);
  poVar1 = std::operator<<(poVar1,"\naddress: ");
  operator<<(poVar1,&obj->address);
  return strm;
}

Assistant:

ostream &operator<<(ostream &strm, const Person &obj) {
    strm << "name: " << obj.name << "\nid: " << obj.id << "\naddress: " << obj.address;
    return strm;
}